

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

ByteData * __thiscall
cfd::api::HDWalletApi::ConvertMnemonicToSeed
          (HDWalletApi *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool strict_check,string *language,bool use_ideographic_space
          ,ByteData *entropy)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  ByteData *in_RDI;
  byte in_R8B;
  string *in_R9;
  byte in_stack_00000008;
  long in_stack_00000010;
  CfdException *e;
  HDWallet wallet;
  ByteData *in_stack_fffffffffffffde8;
  ByteData *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe10;
  char *this_00;
  string local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  HDWallet local_f8;
  ByteData local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  byte local_31;
  string *local_30;
  byte local_21;
  string *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_21 = in_R8B & 1;
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (local_21 != 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      local_50.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                   ,0x2f);
      local_50.filename = local_50.filename + 1;
      local_50.line = 0x3d;
      local_50.funcname = "ConvertMnemonicToSeed";
      core::logger::warn<>
                (&local_50,
                 "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                );
      local_85 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,
                 "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need to set language."
                 ,&local_71);
      core::CfdException::CfdException
                (in_stack_fffffffffffffe10,error_code,in_stack_fffffffffffffe00);
      local_85 = 0;
      __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar1 = core::HDWallet::CheckValidMnemonic(local_18,local_30);
    if (!bVar1) {
      local_a0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                   ,0x2f);
      local_a0.filename = local_a0.filename + 1;
      local_a0.line = 0x48;
      local_a0.funcname = "ConvertMnemonicToSeed";
      this_00 = "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.";
      core::logger::warn<>
                (&local_a0,"Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      local_c2 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,this_00,&local_c1);
      core::CfdException::CfdException
                ((CfdException *)this_00,(CfdError)((ulong)uVar3 >> 0x20),in_stack_fffffffffffffe00)
      ;
      local_c2 = 0;
      __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (in_stack_00000010 != 0)) {
    core::HDWallet::ConvertMnemonicToEntropy(&local_e0,local_18,local_30);
    core::ByteData::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    core::ByteData::~ByteData((ByteData *)0x63bf16);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,local_18);
  std::__cxx11::string::string((string *)&local_130,local_20);
  core::HDWallet::HDWallet(&local_f8,&local_110,&local_130,(bool)(local_31 & 1));
  std::__cxx11::string::~string((string *)&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  core::HDWallet::GetSeed(in_RDI,&local_f8);
  core::HDWallet::~HDWallet((HDWallet *)0x63bfc4);
  return in_RDI;
}

Assistant:

ByteData HDWalletApi::ConvertMnemonicToSeed(
    const std::vector<std::string>& mnemonic, const std::string& passphrase,
    bool strict_check, const std::string& language, bool use_ideographic_space,
    ByteData* entropy) const {
  if (strict_check) {
    if (language.empty()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. If check mnemonic strictly, need "
          "to set language.");
    }

    if (!HDWallet::CheckValidMnemonic(mnemonic, language)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to ConvertMnemonicToSeed. Mnemonic strict check error.");
    }
  }

  try {
    // calculate entropy
    if (!language.empty() && entropy != nullptr) {
      *entropy = HDWallet::ConvertMnemonicToEntropy(mnemonic, language);
    }

    // calculate seed
    HDWallet wallet(mnemonic, passphrase, use_ideographic_space);
    return wallet.GetSeed();
  } catch (CfdException& e) {
    warn(
        CFD_LOG_SOURCE, "Failed to ConvertMnemonicToSeed. error: [{}]",
        e.what());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to ConvertMnemonicToSeed. " + std::string(e.what()));
  }
}